

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O3

void * QRunnable::QGenericRunnable::
       Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5)>
       ::impl(Op op,HelperBase *that,void *arg)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  OpFn p_Var4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  
  if (op == Destroy) {
    operator_delete(that,0x20);
  }
  else if (op == Run) {
    iVar1 = *(int *)((long)&that[1].fn + 4);
    if (0 < iVar1) {
      p_Var4 = that[2].fn;
      iVar2 = *(int *)&that[1].fn;
      lVar7 = (long)iVar2;
      do {
        lVar5 = *(long *)p_Var4;
        lVar8 = lVar7 * 0x10;
        iVar14 = *(int *)(lVar5 + 4 + lVar8);
        if (iVar14 != 0) {
          iVar11 = *(int *)(lVar5 + lVar8);
          uVar12 = *(uint *)(p_Var4 + 0xc);
          uVar3 = *(uint *)(p_Var4 + 0x14);
          iVar9 = (*(int *)(lVar5 + 8 + lVar8) + *(int *)(p_Var4 + 0x10)) % (int)uVar3;
          iVar10 = (*(int *)(p_Var4 + 8) + iVar11) % (int)uVar12;
          iVar10 = (iVar10 >> 0x1f & uVar12) + iVar10;
          do {
            iVar13 = uVar12 - iVar10;
            if (iVar14 <= (int)(uVar12 - iVar10)) {
              iVar13 = iVar14;
            }
            if (0x7ff < iVar13) {
              iVar13 = 0x800;
            }
            plVar6 = *(long **)(p_Var4 + 0x20);
            (**(code **)(p_Var4 + 0x28))
                      ((long)*(int *)(*(long *)p_Var4 + 8 + lVar8) * *(long *)(*plVar6 + 0x28) +
                       *(long *)(*plVar6 + 0x38) + (long)iVar11 * 4,
                       plVar6[0x19] * (long)(int)((iVar9 >> 0x1f & uVar3) + iVar9) + plVar6[0x15] +
                       (long)iVar10 * 4,iVar13);
            iVar11 = iVar11 + iVar13;
            iVar10 = iVar10 + iVar13;
            uVar12 = *(uint *)(p_Var4 + 0xc);
            if ((int)uVar12 <= iVar10) {
              iVar10 = 0;
            }
            iVar14 = iVar14 - iVar13;
          } while (iVar14 != 0);
        }
        lVar7 = lVar7 + 1;
      } while (iVar1 + iVar2 != (int)lVar7);
    }
    QSemaphore::release((int)that[3].fn);
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }